

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<slang::DiagCode,slang::SourceLocation>,void>,std::equal_to<std::tuple<slang::DiagCode,slang::SourceLocation>>,std::allocator<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>const,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>>
::
unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<slang::DiagCode,slang::SourceLocation>,void>,std::equal_to<std::tuple<slang::DiagCode,slang::SourceLocation>>,std::allocator<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>const,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>>
          *this,size_t hash,try_emplace_args_t *args,
          tuple<slang::DiagCode,_slang::SourceLocation> *args_1,
          vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *args_2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  locator local_68;
  arrays_type new_arrays_;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(this + 0x28);
  auVar2._8_8_ = 0x41;
  auVar2._0_8_ = 0xc9714fbcda3ac11;
  fVar3 = ceilf((float)((SUB168(auVar1 * auVar2,8) >> 6) + 1) / 0.875);
  table_arrays<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
  ::new_(&new_arrays_,&local_68,(long)(fVar3 - 9.223372e+18) & (long)fVar3 >> 0x3f | (long)fVar3);
  __return_storage_ptr__->pg = (group15<boost::unordered::detail::foa::plain_integral> *)0x0;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->p =
       (pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
        *)0x0;
  nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>
            (&local_68,this,&new_arrays_,hash >> ((byte)new_arrays_.groups_size_index & 0x3f),hash,
             args,args_1,args_2);
  __return_storage_ptr__->p = local_68.p;
  __return_storage_ptr__->pg = local_68.pg;
  __return_storage_ptr__->n = local_68.n;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = local_68._12_4_;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>,_void>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
  ::unchecked_rehash((table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>,_void>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
                      *)this,&new_arrays_);
  *(long *)(this + 0x28) = *(long *)(this + 0x28) + 1;
  return __return_storage_ptr__;
}

Assistant:

BOOST_NOINLINE locator unchecked_emplace_with_rehash(std::size_t hash, Args&&... args) {
        auto new_arrays_ = new_arrays_for_growth();
        locator it;
        BOOST_TRY {
            /* strong exception guarantee -> try insertion before rehash */
            it = nosize_unchecked_emplace_at(new_arrays_, position_for(hash, new_arrays_), hash,
                                             std::forward<Args>(args)...);
        }